

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keypoints.cpp
# Opt level: O1

bool __thiscall ary::KeypointPlaneLocalizer::add(KeypointPlaneLocalizer *this,Mat *image,float size)

{
  Mat *pMVar1;
  int iVar2;
  int iVar3;
  element_type *peVar4;
  bool bVar5;
  char cVar6;
  undefined8 uVar7;
  value_type *__x;
  bool bVar8;
  float fVar9;
  vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_> keypoints;
  KeypointPlaneModel model;
  Mat descriptors;
  Mat tmp_image1;
  Mat tmp_image2;
  _InputArray local_248;
  KeypointPlaneLocalizer *local_230;
  _InputArray local_228;
  float local_20c;
  value_type *local_208;
  value_type *pvStack_200;
  undefined8 local_1f8;
  _InputArray local_1e8;
  KeypointPlaneModel local_1d0;
  Mat local_150;
  Mat local_f0;
  Mat local_90;
  
  local_230 = this;
  KeypointPlaneModel::KeypointPlaneModel(&local_1d0);
  cv::Mat::Mat(&local_f0);
  cv::Mat::Mat(&local_90);
  cv::Mat::operator=(&local_f0,image);
  local_1d0.size.width = (float)local_f0.size.p[1] * size;
  local_1d0.size.height = (float)*local_f0.size.p * size;
  do {
    cv::Mat::Mat(&local_150);
    local_1f8 = 0;
    local_208 = (value_type *)0x0;
    pvStack_200 = (value_type *)0x0;
    peVar4 = (local_230->detector).super_shared_ptr<cv::Feature2D>.
             super___shared_ptr<cv::Feature2D,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_248.sz.width = 0;
    local_248.sz.height = 0;
    local_248.flags = 0x1010000;
    local_248.obj = &local_f0;
    uVar7 = cv::noArray();
    (**(code **)(*(long *)peVar4 + 0x40))(peVar4,&local_248,&local_208,uVar7);
    peVar4 = (local_230->detector).super_shared_ptr<cv::Feature2D>.
             super___shared_ptr<cv::Feature2D,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_248.sz.width = 0;
    local_248.sz.height = 0;
    local_248.flags = 0x1010000;
    local_228.sz.width = 0;
    local_228.sz.height = 0;
    local_228.flags = 0x2010000;
    local_248.obj = &local_f0;
    local_228.obj = &local_150;
    (**(code **)(*(long *)peVar4 + 0x50))(peVar4,&local_248,&local_208);
    iVar2 = *local_f0.size.p;
    iVar3 = local_f0.size.p[1];
    pMVar1 = &local_1d0.descriptors;
    cVar6 = cv::Mat::empty();
    local_248.obj = pMVar1;
    if (cVar6 == '\0') {
      local_248.sz.width = 0;
      local_248.sz.height = 0;
      local_248.flags = 0x1010000;
      local_228.sz.width = 0;
      local_228.sz.height = 0;
      local_228.flags = 0x1010000;
      local_228.obj = &local_150;
      local_1e8.sz.width = 0;
      local_1e8.sz.height = 0;
      local_1e8.flags = 0x2010000;
      local_1e8.obj = pMVar1;
      cv::vconcat(&local_248,&local_228,(_OutputArray *)&local_1e8);
    }
    else {
      local_248.sz.width = 0;
      local_248.sz.height = 0;
      local_248.flags = 0x2010000;
      cv::Mat::copyTo((_OutputArray *)&local_150);
    }
    if (local_208 != pvStack_200) {
      fVar9 = local_1d0.size.width / (float)iVar3;
      local_20c = local_1d0.size.height / (float)iVar2;
      __x = local_208;
      do {
        (__x->pt).x = (__x->pt).x * fVar9;
        (__x->pt).y = (__x->pt).y * local_20c;
        std::vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>::push_back
                  (&local_1d0.keypoints,__x);
        __x = __x + 1;
      } while (__x != pvStack_200);
    }
    bVar8 = local_230->type != AKAZE;
    bVar5 = 29999 < iVar2 * iVar3;
    if (bVar5 && bVar8) {
      local_248.sz.width = 0;
      local_248.sz.height = 0;
      local_248.flags = 0x1010000;
      local_228.sz.width = 0;
      local_228.sz.height = 0;
      local_228.flags = 0x2010000;
      local_1e8.flags = 0;
      local_1e8._4_4_ = 0;
      local_248.obj = &local_f0;
      local_228.obj = &local_90;
      cv::pyrDown(&local_248,(_OutputArray *)&local_228,(Size_ *)&local_1e8,4);
      cv::Mat::operator=(&local_f0,&local_90);
    }
    if (local_208 != (value_type *)0x0) {
      operator_delete(local_208);
    }
    cv::Mat::~Mat(&local_150);
  } while (bVar5 && bVar8);
  std::vector<ary::KeypointPlaneModel,_std::allocator<ary::KeypointPlaneModel>_>::push_back
            (&local_230->models,&local_1d0);
  cv::Mat::~Mat(&local_90);
  cv::Mat::~Mat(&local_f0);
  KeypointPlaneModel::~KeypointPlaneModel(&local_1d0);
  return true;
}

Assistant:

bool KeypointPlaneLocalizer::add(const Mat& image, float size) {

	KeypointPlaneModel model;

	Mat tmp_image1, tmp_image2;
	tmp_image1 = image;

	model.size = Size2f(tmp_image1.size().width * size, tmp_image1.size().height * size);

	while (true) {
		Mat descriptors;
		vector<KeyPoint> keypoints;

		detector->detect(tmp_image1, keypoints);
		detector->compute(tmp_image1, keypoints, descriptors);
		//descriptors.convertTo(descriptors, CV_32F);

		Size size = tmp_image1.size();
		if (model.descriptors.empty()) {
			descriptors.copyTo(model.descriptors);
		} else {
			vconcat(model.descriptors, descriptors, model.descriptors);
		}

		float xscale = (float) model.size.width / (float) size.width;
		float yscale = (float) model.size.height / (float) size.height;

		for (vector<KeyPoint>::iterator it = keypoints.begin(); it != keypoints.end(); it++) {
			(*it).pt.x *= xscale;
			(*it).pt.y *= yscale;
			model.keypoints.push_back(*it);
		}

		if (type == AKAZE) break; // No need for additional features.

		if (size.width * size.height < 30000) break;

		pyrDown(tmp_image1, tmp_image2, Size());
		tmp_image1 = tmp_image2;
	}

	models.push_back(model);

	return true;
}